

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Flow.c
# Opt level: O2

void Llb_ManFlowCollectAndMarkCone_rec(Aig_Man_t *p,Aig_Obj_t *pObj,Vec_Ptr_t *vCone)

{
  ulong uVar1;
  int iVar2;
  Aig_Obj_t *pObj_00;
  uint uVar3;
  
  iVar2 = Saig_ObjIsLi(p,pObj);
  if ((iVar2 == 0) && (uVar1 = *(ulong *)&pObj->field_0x18, (uVar1 & 0x20) == 0)) {
    if ((uVar1 & 0x10) == 0) {
      if (((uint)uVar1 & 7) - 7 < 0xfffffffe) {
        __assert_fail("Aig_ObjIsNode(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb2Flow.c"
                      ,0x405,
                      "void Llb_ManFlowCollectAndMarkCone_rec(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *)"
                     );
      }
      *(ulong *)&pObj->field_0x18 = uVar1 | 0x20;
      Vec_PtrPush(vCone,pObj);
    }
    if (p->pFanData == (int *)0x0) {
      __assert_fail("p->pFanData",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb2Flow.c"
                    ,0x40a,
                    "void Llb_ManFlowCollectAndMarkCone_rec(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *)")
      ;
    }
    iVar2 = -1;
    for (uVar3 = 0; uVar3 < *(uint *)&pObj->field_0x18 >> 6; uVar3 = uVar3 + 1) {
      if (uVar3 == 0) {
        iVar2 = Aig_ObjFanout0Int(p,pObj->Id);
      }
      else {
        iVar2 = Aig_ObjFanoutNext(p,iVar2);
      }
      pObj_00 = Aig_ManObj(p,iVar2 >> 1);
      Llb_ManFlowCollectAndMarkCone_rec(p,pObj_00,vCone);
    }
  }
  return;
}

Assistant:

void Llb_ManFlowCollectAndMarkCone_rec( Aig_Man_t * p, Aig_Obj_t * pObj, Vec_Ptr_t * vCone )
{
    Aig_Obj_t * pFanout;
    int i, iFanout = -1;
    if ( Saig_ObjIsLi(p, pObj) )
        return;
    if ( pObj->fMarkB )
        return;
    if ( pObj->fMarkA == 0 )
    {
        assert( Aig_ObjIsNode(pObj) );
        pObj->fMarkB = 1;
        if ( Aig_ObjIsNode(pObj) )
            Vec_PtrPush( vCone, pObj );
    }
    Aig_ObjForEachFanout( p, pObj, pFanout, iFanout, i )
        Llb_ManFlowCollectAndMarkCone_rec( p, pFanout, vCone );
}